

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitOutputTest.cpp
# Opt level: O0

void __thiscall
TEST_JUnitOutputTest_TestCaseBlockWithAPackageName_Test::testBody
          (TEST_JUnitOutputTest_TestCaseBlockWithAPackageName_Test *this)

{
  JUnitTestOutput *this_00;
  JUnitTestOutputTestRunner *pJVar1;
  FileForJUnitOutputTests *pFVar2;
  UtestShell *pUVar3;
  char *pcVar4;
  TestTerminator *pTVar5;
  SimpleString local_20;
  TEST_JUnitOutputTest_TestCaseBlockWithAPackageName_Test *local_10;
  TEST_JUnitOutputTest_TestCaseBlockWithAPackageName_Test *this_local;
  
  this_00 = (this->super_TEST_GROUP_CppUTestGroupJUnitOutputTest).junitOutput;
  local_10 = this;
  SimpleString::SimpleString(&local_20,"packagename");
  JUnitTestOutput::setPackageName(this_00,&local_20);
  SimpleString::~SimpleString(&local_20);
  pJVar1 = JUnitTestOutputTestRunner::start
                     ((this->super_TEST_GROUP_CppUTestGroupJUnitOutputTest).testCaseRunner);
  pJVar1 = JUnitTestOutputTestRunner::withGroup(pJVar1,"groupname");
  pJVar1 = JUnitTestOutputTestRunner::withTest(pJVar1,"testname");
  JUnitTestOutputTestRunner::end(pJVar1);
  pFVar2 = FileSystemForJUnitTestOutputTests::file(&fileSystem,"cpputest_packagename_groupname.xml")
  ;
  (this->super_TEST_GROUP_CppUTestGroupJUnitOutputTest).outputFile = pFVar2;
  pUVar3 = UtestShell::getCurrent();
  pcVar4 = FileForJUnitOutputTests::line
                     ((this->super_TEST_GROUP_CppUTestGroupJUnitOutputTest).outputFile,5);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[9])
            (pUVar3,
             "<testcase classname=\"packagename.groupname\" name=\"testname\" assertions=\"0\" time=\"0.000\" file=\"file\" line=\"1\">\n"
             ,pcVar4,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/JUnitOutputTest.cpp"
             ,0x289,pTVar5);
  pUVar3 = UtestShell::getCurrent();
  pcVar4 = FileForJUnitOutputTests::line
                     ((this->super_TEST_GROUP_CppUTestGroupJUnitOutputTest).outputFile,6);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[9])
            (pUVar3,"</testcase>\n",pcVar4,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/JUnitOutputTest.cpp"
             ,0x28a,pTVar5);
  return;
}

Assistant:

TEST(JUnitOutputTest, TestCaseBlockWithAPackageName)
{
    junitOutput->setPackageName("packagename");
    testCaseRunner->start()
            .withGroup("groupname").withTest("testname")
            .end();

    outputFile = fileSystem.file("cpputest_packagename_groupname.xml");

    STRCMP_EQUAL("<testcase classname=\"packagename.groupname\" name=\"testname\" assertions=\"0\" time=\"0.000\" file=\"file\" line=\"1\">\n", outputFile->line(5));
    STRCMP_EQUAL("</testcase>\n", outputFile->line(6));
}